

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void __thiscall QByteArray::reallocData(QByteArray *this,qsizetype alloc,AllocationOption option)

{
  bool bVar1;
  qsizetype qVar2;
  char *pcVar3;
  undefined4 in_EDX;
  QArrayDataPointer<char> *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  bool cannotUseReallocate;
  DataPointer dd;
  undefined8 in_stack_ffffffffffffff98;
  QArrayDataPointer<char> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  QArrayDataPointer<char> *alloc_00;
  QArrayDataPointer<char> *this_00;
  QArrayDataPointer<char> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QArrayDataPointer<char> *)0x0) {
    QArrayDataPointer<char>::fromRawData((char *)in_RDI,(qsizetype)in_stack_ffffffffffffffa0);
    QArrayDataPointer<char>::operator=(in_RDI,in_stack_ffffffffffffffa0);
    QArrayDataPointer<char>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    alloc_00 = in_RDI;
    local_10 = in_RSI;
    qVar2 = QArrayDataPointer<char>::freeSpaceAtBegin(in_RDI);
    uVar4 = CONCAT13(0 < qVar2,(int3)in_stack_ffffffffffffffb0);
    QArrayDataPointer<char>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<char>::needsDetach(in_stack_ffffffffffffffa0);
    if ((bVar1) || ((uVar4 & 0x1000000) != 0)) {
      this_00 = (QArrayDataPointer<char> *)0xaaaaaaaaaaaaaaaa;
      qMin<long_long>((longlong *)&local_10,&in_RDI->size);
      QArrayDataPointer<char>::QArrayDataPointer
                (this_00,(qsizetype)alloc_00,CONCAT44(in_EDX,uVar4),
                 (AllocationOption)((ulong)in_RDI >> 0x20));
      qt_noop();
      pcVar3 = QArrayDataPointer<char>::data((QArrayDataPointer<char> *)&stack0xffffffffffffffc0);
      pcVar3[-0x5555555555555556] = '\0';
      QArrayDataPointer<char>::operator=(in_RDI,local_10);
      QArrayDataPointer<char>::~QArrayDataPointer(local_10);
    }
    else {
      QArrayDataPointer<char>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<char>::reallocate
                ((QPodArrayOps<char> *)in_RDI,(qsizetype)in_stack_ffffffffffffffa0,
                 (AllocationOption)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QByteArray::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}